

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_postfix_expression(parser *this)

{
  bool bVar1;
  type e;
  wostream *pwVar2;
  identifier_expression *this_00;
  wstring *this_01;
  socklen_t *in_RCX;
  parser *in_RSI;
  wchar_t *in_R9;
  wstring_view message;
  bool local_29d;
  wstring local_280 [32];
  undefined1 local_260 [16];
  source_extend local_250;
  mjs local_238 [16];
  wstring local_228;
  wostringstream local_208 [8];
  wostringstream _oss;
  undefined1 local_88 [40];
  undefined1 local_60 [60];
  uint32_t local_24;
  token_type t;
  expression_ptr lhs;
  parser *this_local;
  
  parse_left_hand_side_expression((parser *)&t);
  if ((in_RSI->line_break_skipped_ & 1U) == 0) {
    local_60._56_4_ = current_token_type(in_RSI);
    accept((parser *)local_60,(int)in_RSI,(sockaddr *)0x11,in_RCX);
    bVar1 = token::operator_cast_to_bool((token *)local_60);
    local_29d = true;
    if (!bVar1) {
      accept((parser *)local_88,(int)in_RSI,(sockaddr *)0x12,
             (socklen_t *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1));
      local_29d = token::operator_cast_to_bool((token *)local_88);
      token::~token((token *)local_88);
    }
    token::~token((token *)local_60);
    if (local_29d == false) {
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&t);
    }
    else {
      if ((in_RSI->strict_mode_ & 1U) != 0) {
        e = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&t);
        bVar1 = is_strict_mode_unassignable_identifier(e);
        if (bVar1) {
          std::__cxx11::wostringstream::wostringstream(local_208);
          pwVar2 = std::operator<<((wostream *)local_208,"\"");
          this_00 = (identifier_expression *)
                    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                    operator*((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                              &t);
          this_01 = identifier_expression::id_abi_cxx11_(this_00);
          local_238 = (mjs  [16])
                      std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)this_01);
          cpp_quote_abi_cxx11_(&local_228,local_238,local_238._8_8_);
          pwVar2 = std::operator<<(pwVar2,(wstring *)&local_228);
          std::operator<<(pwVar2,"\" may not be modified in strict mode");
          std::__cxx11::wstring::~wstring((wstring *)&local_228);
          current_extend(&local_250,in_RSI);
          std::__cxx11::wostringstream::str();
          local_260 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_280);
          message._M_str = in_R9;
          message._M_len = local_260._8_8_;
          syntax_error((parser *)"parse_postfix_expression",(char *)0x229,(int)&local_250,
                       local_260._0_8_,message);
        }
      }
      make_expression<mjs::postfix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                (this,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_60 + 0x38));
    }
  }
  else {
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&t);
  }
  local_24 = 1;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&t);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_postfix_expression() {
        auto lhs = parse_left_hand_side_expression();
        // no line break before
        if (line_break_skipped_) {
            return lhs;
        }
        if (auto t = current_token_type(); accept(token_type::plusplus) || accept(token_type::minusminus)) {
            if (strict_mode_ && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be modified in strict mode");
            }
            return make_expression<postfix_expression>(t, std::move(lhs));
        }
        return lhs;
    }